

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestDeprecatedFields::_InternalSerialize
          (TestDeprecatedFields *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestAllTypes_NestedMessage *value;
  _func_int **pp_Var1;
  TestDeprecatedFields *pTVar2;
  ptrdiff_t pVar3;
  uint32_t num;
  bool bVar4;
  int32_t iVar5;
  OneofFieldsCase OVar6;
  int iVar7;
  uint uVar8;
  uint32_t *puVar9;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  WireFormatLite *this_01;
  void *__src;
  UnknownFieldSet *unknown_fields;
  byte *__dest;
  char *in_R9;
  string_view sVar10;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  const_reference local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int local_80;
  int n;
  int i;
  uint32_t cached_has_bits;
  TestDeprecatedFields *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestDeprecatedFields *this_local;
  char *local_50;
  size_t local_48;
  ptrdiff_t size;
  const_reference local_38;
  uint32_t local_2c;
  TestDeprecatedFields *local_28;
  EpsCopyOutputStream *local_20;
  byte *local_18;
  uint local_c;
  
  n = 0;
  _i = this;
  this_ = (TestDeprecatedFields *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar9 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  pTVar2 = this_;
  n = *puVar9;
  if ((n & 4U) != 0) {
    iVar5 = _internal_deprecated_int32(_i);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             ((EpsCopyOutputStream *)pTVar2,iVar5,(uint8_t *)stream_local);
  }
  OVar6 = oneof_fields_case(_i);
  pTVar2 = this_;
  if (OVar6 == kDeprecatedInt32InOneof) {
    iVar5 = _internal_deprecated_int32_in_oneof(_i);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                             ((EpsCopyOutputStream *)pTVar2,iVar5,(uint8_t *)stream_local);
  }
  if ((n & 1U) != 0) {
    value = (_i->field_0)._impl_.deprecated_message_;
    iVar7 = edition_unittest::TestAllTypes_NestedMessage::GetCachedSize
                      ((_i->field_0)._impl_.deprecated_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)value,iVar7,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  local_80 = 0;
  s._4_4_ = _internal_deprecated_repeated_string_size(_i);
  for (; local_80 < s._4_4_; local_80 = local_80 + 1) {
    this_00 = _internal_deprecated_repeated_string_abi_cxx11_(_i);
    local_90 = google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Get(this_00,local_80);
    this_01 = (WireFormatLite *)std::__cxx11::string::data();
    uVar8 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_a0,"edition_unittest.TestDeprecatedFields.deprecated_repeated_string");
    sVar10._M_str = in_R9;
    sVar10._M_len = (size_t)local_a0._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (this_01,(char *)(ulong)uVar8,1,(Operation)local_a0._M_len,sVar10);
    pTVar2 = this_;
    local_28 = this_;
    local_2c = 4;
    local_38 = local_90;
    size = (ptrdiff_t)stream_local;
    local_48 = std::__cxx11::string::size();
    pVar3 = size;
    bVar4 = true;
    if ((long)local_48 < 0x80) {
      pp_Var1 = (pTVar2->super_Message).super_MessageLite._vptr_MessageLite;
      iVar7 = google::protobuf::io::EpsCopyOutputStream::TagSize(local_2c << 3);
      bVar4 = (long)pp_Var1 + (-(long)iVar7 - pVar3) + 0xf < (long)local_48;
    }
    num = local_2c;
    if (bVar4) {
      sVar10 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      local_50 = sVar10._M_str;
      this_local = (TestDeprecatedFields *)sVar10._M_len;
      local_20 = (EpsCopyOutputStream *)
                 google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           ((EpsCopyOutputStream *)pTVar2,num,sVar10,(uint8_t *)size);
    }
    else {
      local_18 = (byte *)size;
      for (local_c = local_2c << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
        *local_18 = (byte)local_c | 0x80;
        local_18 = local_18 + 1;
      }
      *local_18 = (byte)local_c;
      __dest = local_18 + 2;
      local_18[1] = (byte)local_48;
      size = (ptrdiff_t)__dest;
      local_18 = local_18 + 1;
      __src = (void *)std::__cxx11::string::data();
      memcpy(__dest,__src,local_48);
      local_20 = (EpsCopyOutputStream *)(size + local_48);
    }
    stream_local = local_20;
  }
  if ((n & 2U) != 0) {
    pTVar2 = (_i->field_0)._impl_.nested_;
    iVar7 = GetCachedSize((_i->field_0)._impl_.nested_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (5,(MessageLite *)pTVar2,iVar7,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  bVar4 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(_i->super_Message).super_MessageLite._internal_metadata_);
  if (bVar4) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(_i->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestDeprecatedFields::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestDeprecatedFields& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestDeprecatedFields)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 deprecated_int32 = 1 [deprecated = true];
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_deprecated_int32(), target);
  }

  // int32 deprecated_int32_in_oneof = 2 [deprecated = true];
  if (this_.oneof_fields_case() == kDeprecatedInt32InOneof) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_deprecated_int32_in_oneof(), target);
  }

  // .edition_unittest.TestAllTypes.NestedMessage deprecated_message = 3 [deprecated = true];
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.deprecated_message_, this_._impl_.deprecated_message_->GetCachedSize(), target,
        stream);
  }

  // repeated string deprecated_repeated_string = 4 [deprecated = true];
  for (int i = 0, n = this_._internal_deprecated_repeated_string_size(); i < n; ++i) {
    const auto& s = this_._internal_deprecated_repeated_string().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestDeprecatedFields.deprecated_repeated_string");
    target = stream->WriteString(4, s, target);
  }

  // .edition_unittest.TestDeprecatedFields nested = 5;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.nested_, this_._impl_.nested_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestDeprecatedFields)
  return target;
}